

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_kwp.c
# Opt level: O0

err_t beltKWPUnwrap(octet *dest,octet *src,size_t count,octet *header,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t dest_00;
  size_t sVar2;
  octet *key_00;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  octet *header2;
  void *state;
  undefined7 in_stack_ffffffffffffffa8;
  octet in_stack_ffffffffffffffaf;
  blob_t state_00;
  
  if (((in_RDX < 0x20) ||
      ((((in_R9 != (void *)0x10 && (in_R9 != (void *)0x18)) && (in_R9 != (void *)0x20)) ||
       (bVar1 = memIsValid(in_RSI,in_RDX), bVar1 == 0)))) ||
     ((((in_RCX != (void *)0x0 && (bVar1 = memIsValid(in_RCX,0x10), bVar1 == 0)) ||
       (bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 == 0)) ||
      (bVar1 = memIsValid(in_RDI,in_RDX - 0x10), bVar1 == 0)))) {
    return 0x6d;
  }
  beltWBL_keep();
  dest_00 = blobCreate(CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (dest_00 == (blob_t)0x0) {
    return 0x6e;
  }
  state_00 = dest_00;
  sVar2 = beltWBL_keep();
  key_00 = (octet *)((long)dest_00 + sVar2);
  beltWBLStart(state_00,key_00,(size_t)dest_00);
  memCopy(dest_00,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x14bbba);
  memMove(dest_00,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x14bbd2);
  beltWBLStepD2(in_R8,in_R9,(size_t)state_00,key_00);
  if (((in_RCX == (void *)0x0) || (bVar1 = memEq(in_RCX,key_00,0x10), bVar1 != 0)) &&
     ((in_RCX != (void *)0x0 || (bVar1 = memIsZero(key_00,0x10), bVar1 != 0)))) {
    blobClose((blob_t)0x14bc5b);
    return 0;
  }
  memSet(dest_00,in_stack_ffffffffffffffaf,0x14bc3d);
  blobClose((blob_t)0x14bc47);
  return 0x201;
}

Assistant:

err_t beltKWPUnwrap(octet dest[], const octet src[], size_t count,
	const octet header[16], const octet key[], size_t len)
{
	void* state;
	octet* header2;
	// проверить входные данные
	if (count < 32 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsNullOrValid(header, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count - 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKWP_keep() + 16);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	header2 = (octet*)state + beltKWP_keep();
	// снять защиту
	beltKWPStart(state, key, len);
	memCopy(header2, src + count - 16, 16);
	memMove(dest, src, count - 16);
	beltKWPStepD2(dest, header2, count, state);
	if (header && !memEq(header, header2, 16) ||
		header == 0 && !memIsZero(header2, 16))
	{
		memSetZero(dest, count - 16);
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// завершить
	blobClose(state);
	return ERR_OK;
}